

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall ProxyListener::ProxyListener(ProxyListener *this,string *host,uint port)

{
  socklen_t in_ECX;
  
  (this->super_OscPacketListener).super_PacketListener._vptr_PacketListener =
       (_func_int **)&PTR__ProxyListener_0010c9a8;
  (this->proxy_).super___shared_ptr<UdpTransmitSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->proxy_).super___shared_ptr<UdpTransmitSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&this->host_,(string *)host);
  this->port_ = port;
  memset(this->buffer_,0,0x400);
  if (host->_M_string_length != 0) {
    connect(this,(int)host,(sockaddr *)(ulong)port,in_ECX);
  }
  return;
}

Assistant:

ProxyListener(const std::string &host, unsigned port)
            : host_(host), port_(port) {
        buffer_[0] = 0;
        if (host.length() > 0) {
            connect(host, port);
        }
    }